

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::Desugarer::desugarFields(jsonnet::internal::AST*,std::vector<jsonnet::internal::
ObjectField,std::allocator<jsonnet::internal::ObjectField>>&,unsigned_int)::SubstituteSelfSuper::
visitExpr(jsonnet::internal::AST___(void *this,AST **expr)

{
  Identifier **__args;
  uint uVar1;
  AST *pAVar2;
  undefined8 *puVar3;
  long lVar4;
  Identifier *pIVar5;
  Var *pVVar6;
  UStringStream ss;
  Identifier *super_var;
  SuperIndex *super_index;
  Identifier *in_super_var;
  UString local_80;
  InSuper *local_60;
  UString local_58;
  SuperIndex *local_38;
  Identifier *local_30;
  
  pAVar2 = *expr;
  if (pAVar2 == (AST *)0x0) {
LAB_001f5344:
    local_38 = (SuperIndex *)0x0;
  }
  else {
    lVar4 = __dynamic_cast(pAVar2,&AST::typeinfo,&Self::typeinfo,0);
    if (lVar4 != 0) {
      __args = (Identifier **)((long)this + 0x28);
      if (*(long *)((long)this + 0x28) == 0) {
        puVar3 = *(undefined8 **)((long)this + 0x10);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                  ((u32string *)&local_80,L"$outer_self",L"");
        pIVar5 = Allocator::makeIdentifier((Allocator *)*puVar3,&local_80);
        *__args = pIVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT44(local_80.field_2._M_local_buf[1],local_80.field_2._M_local_buf[0]
                                  ) * 4 + 4);
        }
        local_80._M_dataplus._M_p = (pointer)0x0;
        ::std::
        vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
        ::emplace_back<jsonnet::internal::Identifier_const*&,decltype(nullptr)>
                  (*(vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
                     **)((long)this + 0x18),__args,(void **)&local_80);
      }
      pVVar6 = Allocator::
               make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                         (*(Allocator **)((long)this + 8),&(*expr)->location,&(*expr)->openFodder,
                          __args);
      *expr = &pVVar6->super_AST;
      goto LAB_001f553e;
    }
    if (pAVar2 == (AST *)0x0) goto LAB_001f5344;
    local_38 = (SuperIndex *)__dynamic_cast(pAVar2,&AST::typeinfo,&SuperIndex::typeinfo,0);
  }
  if (local_38 == (SuperIndex *)0x0) {
    if (pAVar2 == (AST *)0x0) {
      local_60 = (InSuper *)0x0;
    }
    else {
      local_60 = (InSuper *)__dynamic_cast(pAVar2,&AST::typeinfo,&InSuper::typeinfo,0);
    }
    if (local_60 == (InSuper *)0x0) goto LAB_001f553e;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = L'\0';
    ::std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&local_80,L"$outer_in_super");
    uVar1 = **(uint **)((long)this + 0x20);
    **(uint **)((long)this + 0x20) = uVar1 + 1;
    UStringStream::operator<<((UStringStream *)&local_80,uVar1);
    puVar3 = *(undefined8 **)((long)this + 0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::u32string::_M_construct<char32_t*>
              ((u32string *)&local_58,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    local_30 = Allocator::makeIdentifier((Allocator *)*puVar3,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity * 4 + 4);
    }
    ::std::
    vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
    ::emplace_back<jsonnet::internal::Identifier_const*&,jsonnet::internal::InSuper*&>
              (*(vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
                 **)((long)this + 0x18),&local_30,&local_60);
    pVVar6 = Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                       (*(Allocator **)((long)this + 8),&(*expr)->location,&(*expr)->openFodder,
                        &local_30);
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = L'\0';
    ::std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    append(&local_80,L"$outer_super_index");
    uVar1 = **(uint **)((long)this + 0x20);
    **(uint **)((long)this + 0x20) = uVar1 + 1;
    UStringStream::operator<<((UStringStream *)&local_80,uVar1);
    puVar3 = *(undefined8 **)((long)this + 0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::u32string::_M_construct<char32_t*>
              ((u32string *)&local_58,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    local_60 = (InSuper *)Allocator::makeIdentifier((Allocator *)*puVar3,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity * 4 + 4);
    }
    if (local_38->index == (AST *)0x0) {
      __assert_fail("super_index->index != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/desugarer.cpp"
                    ,0x170,
                    "virtual void jsonnet::internal::Desugarer::desugarFields(AST *, ObjectFields &, unsigned int)::SubstituteSelfSuper::visitExpr(AST *&)"
                   );
    }
    ::std::
    vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
    ::emplace_back<jsonnet::internal::Identifier_const*&,jsonnet::internal::SuperIndex*&>
              (*(vector<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*,jsonnet::internal::AST*>>>
                 **)((long)this + 0x18),(Identifier **)&local_60,&local_38);
    pVVar6 = Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                       (*(Allocator **)((long)this + 8),&(*expr)->location,&(*expr)->openFodder,
                        (Identifier **)&local_60);
  }
  *expr = &pVVar6->super_AST;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT44(local_80.field_2._M_local_buf[1],local_80.field_2._M_local_buf[0]) * 4
                    + 4);
  }
LAB_001f553e:
  CompilerPass::visitExpr((CompilerPass *)this,expr);
  return;
}

Assistant:

void visitExpr(AST *&expr)
            {
                if (dynamic_cast<Self *>(expr)) {
                    if (newSelf == nullptr) {
                        newSelf = desugarer->id(U"$outer_self");
                        superVars.emplace_back(newSelf, nullptr);
                    }
                    expr = alloc.make<Var>(expr->location, expr->openFodder, newSelf);
                } else if (auto *super_index = dynamic_cast<SuperIndex *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_super_index" << (counter++);
                    const Identifier *super_var = desugarer->id(ss.str());
                    // Desugaring of expr should already have occurred.
                    assert(super_index->index != nullptr);
                    // Re-use super_index since we're replacing it here.
                    superVars.emplace_back(super_var, super_index);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, super_var);
                } else if (auto *in_super = dynamic_cast<InSuper *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_in_super" << (counter++);
                    const Identifier *in_super_var = desugarer->id(ss.str());
                    // Re-use in_super since we're replacing it here.
                    superVars.emplace_back(in_super_var, in_super);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, in_super_var);
                }
                CompilerPass::visitExpr(expr);
            }